

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall
fineftp::FtpSession::sendFtpMessage(FtpSession *this,FtpReplyCode code,string *message)

{
  undefined1 local_38 [40];
  
  local_38._0_4_ = code;
  ::std::__cxx11::string::string((string *)(local_38 + 8),(string *)message);
  sendFtpMessage(this,(FtpMessage *)local_38);
  ::std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void FtpSession::sendFtpMessage(FtpReplyCode code, const std::string& message)
  {
    sendFtpMessage(FtpMessage(code, message));
  }